

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

void __thiscall Kernel::Problem::addUnits(Problem *this,UnitList *newUnits)

{
  bool bVar1;
  Unit *pUVar2;
  List<Kernel::Unit_*> *in_RSI;
  UnitList *in_RDI;
  Property *unaff_retaddr;
  Unit *u;
  Iterator uit;
  Problem *in_stack_00000030;
  Clause *in_stack_ffffffffffffffe0;
  Iterator in_stack_ffffffffffffffe8;
  UnitList *units;
  
  units = in_RDI;
  Lib::List<Kernel::Unit_*>::Iterator::Iterator((Iterator *)&stack0xffffffffffffffe8,in_RSI);
  while (bVar1 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x92b7b0), bVar1) {
    in_stack_ffffffffffffffe0 =
         (Clause *)Lib::List<Kernel::Unit_*>::Iterator::next((Iterator *)in_stack_ffffffffffffffe0);
    bVar1 = Unit::isClause((Unit *)in_stack_ffffffffffffffe0);
    if (bVar1) {
      Clause::incRefCnt(in_stack_ffffffffffffffe0);
    }
  }
  pUVar2 = (Unit *)Lib::List<Kernel::Unit_*>::concat
                             (in_stack_ffffffffffffffe8._lst,
                              (List<Kernel::Unit_*> *)in_stack_ffffffffffffffe0);
  in_RDI->_head = pUVar2;
  if (((ulong)in_RDI[0x10]._head & 1) == 0) {
    invalidateEverything((Problem *)unaff_retaddr);
  }
  else {
    Shell::Property::add(unaff_retaddr,units);
    readDetailsFromProperty(in_stack_00000030);
  }
  return;
}

Assistant:

void Problem::addUnits(UnitList* newUnits)
{
  UnitList::Iterator uit(newUnits);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    if(u->isClause()) {
      static_cast<Clause*>(u)->incRefCnt();
    }
  }
  _units = UnitList::concat(newUnits, _units);
  if(_propertyValid) {
    TIME_TRACE(TimeTrace::PROPERTY_EVALUATION);
    _property->add(newUnits);
    readDetailsFromProperty();
  }
  else {
    invalidateEverything();
  }
}